

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O0

void __thiscall QStyleOptionTab::QStyleOptionTab(QStyleOptionTab *this,int version)

{
  undefined4 in_ESI;
  long in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  undefined4 in_stack_00000008;
  undefined4 in_stack_fffffffffffffff0;
  
  QStyleOption::QStyleOption
            ((QStyleOption *)CONCAT44(version,in_stack_00000008),unaff_retaddr_00,unaff_retaddr);
  *(undefined4 *)(in_RDI + 0x40) = 0;
  QString::QString((QString *)0x41d14c);
  QIcon::QIcon((QIcon *)(in_RDI + 0x60));
  *(undefined4 *)(in_RDI + 0x68) = 0;
  *(undefined4 *)(in_RDI + 0x6c) = 0;
  *(undefined4 *)(in_RDI + 0x70) = 0;
  QFlags<QStyleOptionTab::CornerWidget>::QFlags
            ((QFlags<QStyleOptionTab::CornerWidget> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (CornerWidget)((ulong)in_RDI >> 0x20));
  QSize::QSize((QSize *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  *(undefined1 *)(in_RDI + 0x80) = 0;
  QSize::QSize((QSize *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  QSize::QSize((QSize *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  QFlags<QStyleOptionTab::TabFeature>::QFlags
            ((QFlags<QStyleOptionTab::TabFeature> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (TabFeature)((ulong)in_RDI >> 0x20));
  *(undefined4 *)(in_RDI + 0x98) = 0xffffffff;
  return;
}

Assistant:

QStyleOptionTab::QStyleOptionTab(int version)
    : QStyleOption(version, SO_Tab),
      shape(QTabBar::RoundedNorth),
      row(0),
      position(Beginning),
      selectedPosition(NotAdjacent), cornerWidgets(QStyleOptionTab::NoCornerWidgets),
      documentMode(false),
      features(QStyleOptionTab::None)
{
}